

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

b_face * __thiscall
xray_re::xr_mesh_builder::b_face::set
          (b_face *this,uint32_t signature,uint32_t x0,uint32_t x1,uint32_t x2)

{
  if (signature != 0) {
    if ((signature & 1) != 0) {
      (this->field_0).field_0.v[0] = x0;
      (this->field_0).field_0.v[1] = x1;
      (this->field_0).field_0.v[2] = x2;
    }
    if ((signature & 2) != 0) {
      (this->field_0).field_0.n[0] = x0;
      (this->field_0).field_0.n[1] = x1;
      (this->field_0).field_0.n[2] = x2;
    }
    if ((signature & 4) != 0) {
      (this->field_0).field_0.tc[0] = x0;
      (this->field_0).field_0.tc[1] = x1;
      (this->field_0).field_0.tc[2] = x2;
    }
    return this;
  }
  __assert_fail("signature",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                ,10,
                "xr_mesh_builder::b_face &xray_re::xr_mesh_builder::b_face::set(uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

xr_mesh_builder::b_face& xr_mesh_builder::b_face::set(uint32_t signature, uint32_t x0, uint32_t x1, uint32_t x2)
{
	xr_assert(signature);
	if (signature & xr_vbuf::S_POINTS) {
		v0 = x0;
		v1 = x1;
		v2 = x2;
	}
	if (signature & xr_vbuf::S_NORMALS) {
		n0 = x0;
		n1 = x1;
		n2 = x2;
	}
	if (signature & xr_vbuf::S_TEXCOORDS) {
		tc0 = x0;
		tc1 = x1;
		tc2 = x2;
	}
	return *this;
}